

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

SUNErrCode
SUNMemoryHelper_Copy
          (SUNMemoryHelper helper,SUNMemory dst,SUNMemory src,size_t memory_size,void *queue)

{
  SUNErrCode SVar1;
  
  SVar1 = (*helper->ops->copy)(helper,dst,src,memory_size,queue);
  return SVar1;
}

Assistant:

SUNErrCode SUNMemoryHelper_Copy(SUNMemoryHelper helper, SUNMemory dst,
                                SUNMemory src, size_t memory_size, void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->copy, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  ier = helper->ops->copy(helper, dst, src, memory_size, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}